

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[10],unsigned_long&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_long *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [2])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  kj *local_a0;
  size_t local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  CappedArray<char,_26UL> local_70;
  CappedArray<char,_14UL> local_48;
  
  local_98 = strlen((char *)this);
  local_a0 = this;
  _::Stringifier::operator*
            ((CappedArray<char,_26UL> *)(local_80 + 0x10),(Stringifier *)&_::STR,
             *(unsigned_long *)*params);
  local_80._8_8_ = strlen((char *)params_1);
  local_80._0_8_ = params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_2);
  local_90._8_8_ = strlen((char *)params_3);
  local_90._0_8_ = params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_a0,(ArrayPtr<const_char> *)(local_80 + 0x10),
             (CappedArray<char,_26UL> *)local_80,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_90,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}